

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uchar *output;
  uchar *output_00;
  
  iVar1 = -0x4080;
  if (((hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) && (ctx->padding == 0))
     && (iVar1 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,ctx->len,sig), iVar1 == 0)) {
    __size = ctx->len;
    output = (uchar *)calloc(1,__size);
    iVar1 = -0x10;
    if (output != (uchar *)0x0) {
      output_00 = (uchar *)calloc(1,__size);
      if (output_00 == (uchar *)0x0) {
        free(output);
      }
      else {
        iVar1 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,output);
        if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_public(ctx,output,output_00), iVar1 == 0)) {
          iVar2 = mbedtls_ct_memcmp(output_00,sig,ctx->len);
          iVar1 = -0x4300;
          if (iVar2 == 0) {
            switchD_015df945::default(sig,output,ctx->len);
            iVar1 = 0;
          }
        }
        mbedtls_zeroize_and_free(output,ctx->len);
        mbedtls_zeroize_and_free(output_00,ctx->len);
        if (iVar1 == 0) {
          iVar1 = 0;
        }
        else {
          switchD_010444a0::default(sig,0x21,ctx->len);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign(mbedtls_rsa_context *ctx,
                                      int (*f_rng)(void *, unsigned char *, size_t),
                                      void *p_rng,
                                      mbedtls_md_type_t md_alg,
                                      unsigned int hashlen,
                                      const unsigned char *hash,
                                      unsigned char *sig)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *sig_try = NULL, *verif = NULL;

    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /*
     * Prepare PKCS1-v1.5 encoding (padding and hash identifier)
     */

    if ((ret = rsa_rsassa_pkcs1_v15_encode(md_alg, hashlen, hash,
                                           ctx->len, sig)) != 0) {
        return ret;
    }

    /* Private key operation
     *
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */

    sig_try = (unsigned char*) mbedtls_calloc(1, ctx->len);
    if (sig_try == NULL) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    verif = (unsigned char*) mbedtls_calloc(1, ctx->len);
    if (verif == NULL) {
        mbedtls_free(sig_try);
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    MBEDTLS_MPI_CHK(mbedtls_rsa_private(ctx, f_rng, p_rng, sig, sig_try));
    MBEDTLS_MPI_CHK(mbedtls_rsa_public(ctx, sig_try, verif));

    if (mbedtls_ct_memcmp(verif, sig, ctx->len) != 0) {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy(sig, sig_try, ctx->len);

cleanup:
    mbedtls_zeroize_and_free(sig_try, ctx->len);
    mbedtls_zeroize_and_free(verif, ctx->len);

    if (ret != 0) {
        memset(sig, '!', ctx->len);
    }
    return ret;
}